

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  *psVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  error_handler *begin_00;
  size_t in_R8;
  basic_string_view<char> id;
  byte *local_50;
  format_arg local_48;
  
  local_50 = (byte *)begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format.h"
                ,0xa8e,"");
  }
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    psVar2 = handler->handler;
    specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::get_arg(&local_48,
              &psVar2->
               super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             );
    iVar3 = get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
                      ();
    ((psVar2->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = iVar3;
    pbVar6 = (byte *)begin;
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      local_50 = (byte *)(begin + 1);
      iVar3 = 0;
      begin_00 = (error_handler *)begin;
    }
    else {
      begin_00 = (error_handler *)&local_50;
      iVar3 = parse_nonnegative_int<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&,char>&>
                        ((char **)begin_00,end,handler);
    }
    begin = (char *)begin_00;
    if ((local_50 == (byte *)end) || ((*local_50 != 0x3a && (*local_50 != 0x7d)))) {
LAB_004d78cc:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    psVar2 = handler->handler;
    specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::get_arg(&local_48,
              &psVar2->
               super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              ,iVar3);
    iVar3 = get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
                      ();
    ((psVar2->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = iVar3;
    pbVar6 = local_50;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_004d78cc;
    pbVar5 = (byte *)(begin + 1);
    do {
      pbVar4 = pbVar5;
      pbVar6 = (byte *)end;
      if (pbVar4 == (byte *)end) break;
      bVar1 = *pbVar4;
      pbVar5 = pbVar4 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar6 = pbVar4, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    id.data_ = pbVar6 + -(long)begin;
    if ((long)id.data_ < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    psVar2 = handler->handler;
    id.size_ = in_R8;
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,fmt::v7::basic_string_view<char>>
              (&local_48,
               (detail *)
               (psVar2->
               super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
               ).context_,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)begin,id);
    iVar3 = get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
                      ();
    ((psVar2->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = iVar3;
  }
  return (char *)pbVar6;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}